

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O0

void __thiscall SQArray::Pop(SQArray *this)

{
  SQArray *in_RDI;
  
  sqvector<SQObjectPtr>::pop_back((sqvector<SQObjectPtr> *)0x11ac0c);
  ShrinkIfNeeded(in_RDI);
  return;
}

Assistant:

void Pop(){_values.pop_back(); ShrinkIfNeeded(); }